

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O0

string * __thiscall antlr::CommonAST::getText_abi_cxx11_(CommonAST *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x28));
  return in_RDI;
}

Assistant:

string getText() const
	{
		return text;
	}